

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O1

void knote_index_RB_INSERT_COLOR(knote_index *head,knote *elm)

{
  knote *pkVar1;
  knote *pkVar2;
  knote *pkVar3;
  knote *pkVar4;
  anon_struct_32_4_548b78d9_for_kn_index *paVar5;
  
  pkVar3 = (elm->kn_index).rbe_parent;
  do {
    if ((pkVar3 == (knote *)0x0) || ((pkVar3->kn_index).rbe_color != 1)) {
      (head->rbh_root->kn_index).rbe_color = 0;
      return;
    }
    pkVar2 = (pkVar3->kn_index).rbe_parent;
    pkVar4 = (pkVar2->kn_index).rbe_left;
    pkVar1 = elm;
    if (pkVar3 == pkVar4) {
      pkVar4 = (pkVar2->kn_index).rbe_right;
      if ((pkVar4 != (knote *)0x0) && ((pkVar4->kn_index).rbe_color == 1)) goto LAB_0010351a;
      pkVar4 = (pkVar3->kn_index).rbe_right;
      if (pkVar4 == elm) {
        pkVar1 = (pkVar4->kn_index).rbe_left;
        (pkVar3->kn_index).rbe_right = pkVar1;
        if (pkVar1 != (knote *)0x0) {
          (pkVar1->kn_index).rbe_parent = pkVar3;
        }
        pkVar1 = (pkVar3->kn_index).rbe_parent;
        (pkVar4->kn_index).rbe_parent = pkVar1;
        paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
        if (pkVar1 != (knote *)0x0) {
          pkVar1 = (pkVar3->kn_index).rbe_parent;
          paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar1->kn_index).rbe_right;
          if (pkVar3 == (pkVar1->kn_index).rbe_left) {
            paVar5 = &pkVar1->kn_index;
          }
        }
        paVar5->rbe_left = pkVar4;
        (pkVar4->kn_index).rbe_left = pkVar3;
        (pkVar3->kn_index).rbe_parent = pkVar4;
        pkVar1 = pkVar3;
        pkVar3 = elm;
      }
      (pkVar3->kn_index).rbe_color = 0;
      (pkVar2->kn_index).rbe_color = 1;
      pkVar3 = (pkVar2->kn_index).rbe_left;
      pkVar4 = (pkVar3->kn_index).rbe_right;
      (pkVar2->kn_index).rbe_left = pkVar4;
      if (pkVar4 != (knote *)0x0) {
        (pkVar4->kn_index).rbe_parent = pkVar2;
      }
      pkVar4 = (pkVar2->kn_index).rbe_parent;
      (pkVar3->kn_index).rbe_parent = pkVar4;
      paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
      if (pkVar4 != (knote *)0x0) {
        pkVar4 = (pkVar2->kn_index).rbe_parent;
        paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar4->kn_index).rbe_right;
        if (pkVar2 == (pkVar4->kn_index).rbe_left) {
          paVar5 = &pkVar4->kn_index;
        }
      }
      paVar5->rbe_left = pkVar3;
      (pkVar3->kn_index).rbe_right = pkVar2;
LAB_00103671:
      (pkVar2->kn_index).rbe_parent = pkVar3;
      pkVar2 = pkVar1;
    }
    else {
      if ((pkVar4 == (knote *)0x0) || ((pkVar4->kn_index).rbe_color != 1)) {
        pkVar4 = (pkVar3->kn_index).rbe_left;
        if (pkVar4 == elm) {
          pkVar1 = (pkVar4->kn_index).rbe_right;
          (pkVar3->kn_index).rbe_left = pkVar1;
          if (pkVar1 != (knote *)0x0) {
            (pkVar1->kn_index).rbe_parent = pkVar3;
          }
          pkVar1 = (pkVar3->kn_index).rbe_parent;
          (pkVar4->kn_index).rbe_parent = pkVar1;
          paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
          if (pkVar1 != (knote *)0x0) {
            pkVar1 = (pkVar3->kn_index).rbe_parent;
            paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar1->kn_index).rbe_right;
            if (pkVar3 == (pkVar1->kn_index).rbe_left) {
              paVar5 = &pkVar1->kn_index;
            }
          }
          paVar5->rbe_left = pkVar4;
          (pkVar4->kn_index).rbe_right = pkVar3;
          (pkVar3->kn_index).rbe_parent = pkVar4;
          pkVar1 = pkVar3;
          pkVar3 = elm;
        }
        (pkVar3->kn_index).rbe_color = 0;
        (pkVar2->kn_index).rbe_color = 1;
        pkVar3 = (pkVar2->kn_index).rbe_right;
        pkVar4 = (pkVar3->kn_index).rbe_left;
        (pkVar2->kn_index).rbe_right = pkVar4;
        if (pkVar4 != (knote *)0x0) {
          (pkVar4->kn_index).rbe_parent = pkVar2;
        }
        pkVar4 = (pkVar2->kn_index).rbe_parent;
        (pkVar3->kn_index).rbe_parent = pkVar4;
        paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)head;
        if (pkVar4 != (knote *)0x0) {
          pkVar4 = (pkVar2->kn_index).rbe_parent;
          paVar5 = (anon_struct_32_4_548b78d9_for_kn_index *)&(pkVar4->kn_index).rbe_right;
          if (pkVar2 == (pkVar4->kn_index).rbe_left) {
            paVar5 = &pkVar4->kn_index;
          }
        }
        paVar5->rbe_left = pkVar3;
        (pkVar3->kn_index).rbe_left = pkVar2;
        goto LAB_00103671;
      }
LAB_0010351a:
      (pkVar4->kn_index).rbe_color = 0;
      (pkVar3->kn_index).rbe_color = 0;
      (pkVar2->kn_index).rbe_color = 1;
    }
    pkVar3 = (pkVar2->kn_index).rbe_parent;
    elm = pkVar2;
  } while( true );
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}